

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.cpp
# Opt level: O2

void __thiscall mnf::Manifold::~Manifold(Manifold *this)

{
  this->_vptr_Manifold = (_func_int **)&PTR__Manifold_0019a7d0;
  std::__cxx11::string::~string((string *)&this->name_);
  (this->super_ValidManifold).flag_ = -0x1033c4d6;
  RefCounter::~RefCounter(&this->super_RefCounter);
  return;
}

Assistant:

Manifold::~Manifold() {}